

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

ostream * operator<<(ostream *os,parser *x)

{
  pointer pdVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  int iVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  pointer pbVar6;
  definition *definition;
  pointer pdVar7;
  char local_31;
  
  pdVar1 = (x->definitions).
           super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar7 = (x->definitions).
                super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar7 != pdVar1; pdVar7 = pdVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
    pbVar2 = (pdVar7->flags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (pdVar7->flags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
      pbVar3 = (pdVar7->flags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __n = pbVar6->_M_string_length;
      if ((__n != pbVar3[-1]._M_string_length) ||
         ((__n != 0 &&
          (iVar4 = bcmp((pbVar6->_M_dataplus)._M_p,pbVar3[-1]._M_dataplus._M_p,__n), iVar4 != 0))))
      {
        std::__ostream_insert<char,std::char_traits<char>>(os,anon_var_dwarf_172a80 + 3,2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n        ",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pdVar7->help)._M_dataplus._M_p,(pdVar7->help)._M_string_length);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
  }
  return os;
}

Assistant:

inline
std::ostream& operator << (std::ostream& os, const argagg::parser& x)
{
  for (auto& definition : x.definitions) {
    os << "    ";
    for (auto& flag : definition.flags) {
      os << flag;
      if (flag != definition.flags.back()) {
        os << ", ";
      }
    }
    os << "\n        " << definition.help << '\n';
  }
  return os;
}